

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_avx2.c
# Opt level: O0

uint masked_sad16xh_avx2(uint8_t *src_ptr,int src_stride,uint8_t *a_ptr,int a_stride,uint8_t *b_ptr,
                        int b_stride,uint8_t *m_ptr,int m_stride,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  long in_stack_00000008;
  int32_t sad;
  __m256i pred_r;
  __m256i mask_r;
  __m256i data_r;
  __m256i pred_l;
  __m256i mask_l;
  __m256i data_l;
  __m256i m_inv;
  __m256i m;
  __m256i b;
  __m256i a;
  __m256i src;
  __m256i round_scale;
  __m256i mask_max;
  __m256i res;
  int y;
  void *lo;
  void *hi;
  undefined1 in_stack_fffffffffffff960 [32];
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_4e0 [32];
  undefined4 local_4b0;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  local_4e0 = ZEXT1632(ZEXT816(0));
  auVar1 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar1 = vpinsrb_avx(auVar1,0x40,2);
  auVar1 = vpinsrb_avx(auVar1,0x40,3);
  auVar1 = vpinsrb_avx(auVar1,0x40,4);
  auVar1 = vpinsrb_avx(auVar1,0x40,5);
  auVar1 = vpinsrb_avx(auVar1,0x40,6);
  auVar1 = vpinsrb_avx(auVar1,0x40,7);
  auVar1 = vpinsrb_avx(auVar1,0x40,8);
  auVar1 = vpinsrb_avx(auVar1,0x40,9);
  auVar1 = vpinsrb_avx(auVar1,0x40,10);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xb);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xc);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xd);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xe);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar2 = vpinsrb_avx(auVar2,0x40,2);
  auVar2 = vpinsrb_avx(auVar2,0x40,3);
  auVar2 = vpinsrb_avx(auVar2,0x40,4);
  auVar2 = vpinsrb_avx(auVar2,0x40,5);
  auVar2 = vpinsrb_avx(auVar2,0x40,6);
  auVar2 = vpinsrb_avx(auVar2,0x40,7);
  auVar2 = vpinsrb_avx(auVar2,0x40,8);
  auVar2 = vpinsrb_avx(auVar2,0x40,9);
  auVar2 = vpinsrb_avx(auVar2,0x40,10);
  auVar2 = vpinsrb_avx(auVar2,0x40,0xb);
  auVar2 = vpinsrb_avx(auVar2,0x40,0xc);
  auVar2 = vpinsrb_avx(auVar2,0x40,0xd);
  auVar2 = vpinsrb_avx(auVar2,0x40,0xe);
  auVar2 = vpinsrb_avx(auVar2,0x40,0xf);
  uStack_b0 = auVar2._0_8_;
  uStack_a8 = auVar2._8_8_;
  auVar2 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar2 = vpinsrw_avx(auVar2,0x200,2);
  auVar2 = vpinsrw_avx(auVar2,0x200,3);
  auVar2 = vpinsrw_avx(auVar2,0x200,4);
  auVar2 = vpinsrw_avx(auVar2,0x200,5);
  auVar2 = vpinsrw_avx(auVar2,0x200,6);
  auVar2 = vpinsrw_avx(auVar2,0x200,7);
  auVar3 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar3 = vpinsrw_avx(auVar3,0x200,2);
  auVar3 = vpinsrw_avx(auVar3,0x200,3);
  auVar3 = vpinsrw_avx(auVar3,0x200,4);
  auVar3 = vpinsrw_avx(auVar3,0x200,5);
  auVar3 = vpinsrw_avx(auVar3,0x200,6);
  auVar3 = vpinsrw_avx(auVar3,0x200,7);
  auVar7._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar7._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  auVar8 = auVar7;
  for (local_4b0 = 0; local_4b0 < m_stride; local_4b0 = local_4b0 + 2) {
    hi = in_stack_fffffffffffff960._8_8_;
    lo = in_stack_fffffffffffff960._0_8_;
    yy_loadu2_128(hi,lo);
    auVar9 = auVar8;
    yy_loadu2_128(hi,lo);
    auVar10 = auVar9;
    yy_loadu2_128(hi,lo);
    auVar11 = auVar10;
    yy_loadu2_128(hi,lo);
    auVar5._16_8_ = uStack_b0;
    auVar5._0_16_ = auVar1;
    auVar5._24_8_ = uStack_a8;
    auVar4 = vpsubb_avx2(auVar5,auVar11);
    auVar5 = vpunpcklbw_avx2(auVar9,auVar10);
    auVar6 = vpunpcklbw_avx2(auVar11,auVar4);
    auVar5 = vpmaddubsw_avx2(auVar5,auVar6);
    uStack_510 = auVar7._16_8_;
    uStack_508 = auVar7._24_8_;
    auVar6._16_8_ = uStack_510;
    auVar6._0_16_ = auVar7._0_16_;
    auVar6._24_8_ = uStack_508;
    auVar6 = vpmulhrsw_avx2(auVar5,auVar6);
    auVar5 = vpunpckhbw_avx2(auVar9,auVar10);
    auVar4 = vpunpckhbw_avx2(auVar11,auVar4);
    auVar5 = vpmaddubsw_avx2(auVar5,auVar4);
    auVar4._16_8_ = uStack_510;
    auVar4._0_16_ = auVar7._0_16_;
    auVar4._24_8_ = uStack_508;
    auVar5 = vpmulhrsw_avx2(auVar5,auVar4);
    in_stack_fffffffffffff960 = vpackuswb_avx2(auVar6,auVar5);
    auVar8 = vpsadbw_avx2(in_stack_fffffffffffff960,auVar8);
    auVar8 = vpaddd_avx2(local_4e0,auVar8);
    in_stack_00000008 = in_stack_00000008 + ((int)m_ptr << 1);
    local_4e0 = auVar8;
  }
  auVar8 = vpshufd_avx2(local_4e0,0xd8);
  auVar8 = vpermq_avx2(auVar8,0xd8);
  auVar8 = vphaddd_avx2(auVar8,auVar8);
  auVar8 = vphaddd_avx2(auVar8,auVar8);
  local_4e0._0_4_ = auVar8._0_4_;
  return local_4e0._0_4_;
}

Assistant:

static inline unsigned int masked_sad16xh_avx2(
    const uint8_t *src_ptr, int src_stride, const uint8_t *a_ptr, int a_stride,
    const uint8_t *b_ptr, int b_stride, const uint8_t *m_ptr, int m_stride,
    int height) {
  int y;
  __m256i res = _mm256_setzero_si256();
  const __m256i mask_max = _mm256_set1_epi8((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m256i round_scale =
      _mm256_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  for (y = 0; y < height; y += 2) {
    const __m256i src = yy_loadu2_128(src_ptr + src_stride, src_ptr);
    const __m256i a = yy_loadu2_128(a_ptr + a_stride, a_ptr);
    const __m256i b = yy_loadu2_128(b_ptr + b_stride, b_ptr);
    const __m256i m = yy_loadu2_128(m_ptr + m_stride, m_ptr);
    const __m256i m_inv = _mm256_sub_epi8(mask_max, m);

    // Calculate 16 predicted pixels.
    // Note that the maximum value of any entry of 'pred_l' or 'pred_r'
    // is 64 * 255, so we have plenty of space to add rounding constants.
    const __m256i data_l = _mm256_unpacklo_epi8(a, b);
    const __m256i mask_l = _mm256_unpacklo_epi8(m, m_inv);
    __m256i pred_l = _mm256_maddubs_epi16(data_l, mask_l);
    pred_l = _mm256_mulhrs_epi16(pred_l, round_scale);

    const __m256i data_r = _mm256_unpackhi_epi8(a, b);
    const __m256i mask_r = _mm256_unpackhi_epi8(m, m_inv);
    __m256i pred_r = _mm256_maddubs_epi16(data_r, mask_r);
    pred_r = _mm256_mulhrs_epi16(pred_r, round_scale);

    const __m256i pred = _mm256_packus_epi16(pred_l, pred_r);
    res = _mm256_add_epi32(res, _mm256_sad_epu8(pred, src));

    src_ptr += src_stride << 1;
    a_ptr += a_stride << 1;
    b_ptr += b_stride << 1;
    m_ptr += m_stride << 1;
  }
  // At this point, we have two 32-bit partial SADs in lanes 0 and 2 of 'res'.
  res = _mm256_shuffle_epi32(res, 0xd8);
  res = _mm256_permute4x64_epi64(res, 0xd8);
  res = _mm256_hadd_epi32(res, res);
  res = _mm256_hadd_epi32(res, res);
  int32_t sad = _mm256_extract_epi32(res, 0);
  return sad;
}